

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O3

int __thiscall Quartet::ncart(Quartet *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar1 = (this->bra).left.ijk._M_elems[2];
  iVar5 = (this->bra).left.ijk._M_elems[1] + (this->bra).left.ijk._M_elems[0];
  iVar6 = (this->bra).right.ijk._M_elems[1] + (this->bra).right.ijk._M_elems[0];
  iVar2 = (this->bra).right.ijk._M_elems[2];
  iVar7 = (this->ket).left.ijk._M_elems[1] + (this->ket).left.ijk._M_elems[0];
  iVar3 = (this->ket).left.ijk._M_elems[2];
  iVar8 = (this->ket).right.ijk._M_elems[1] + (this->ket).right.ijk._M_elems[0];
  iVar4 = (this->ket).right.ijk._M_elems[2];
  return (((iVar4 + iVar8 + 2) * (iVar4 + iVar8 + 1)) / 2) *
         (((iVar7 + iVar3 + 2) * (iVar3 + iVar7 + 1)) / 2) *
         (((iVar6 + iVar2 + 2) * (iVar2 + iVar6 + 1)) / 2) *
         (((iVar5 + iVar1 + 2) * (iVar1 + iVar5 + 1)) / 2);
}

Assistant:

int am(void) const { return ijk[0] + ijk[1] + ijk[2]; }